

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::HandleInitExpr(BinaryReaderObjdump *this,InitExpr *expr)

{
  uint64_t uVar1;
  undefined4 uVar2;
  Result RVar3;
  Enum extraout_EAX;
  
  if (this->in_data_section_ == true) {
    *(undefined8 *)((long)&(this->data_init_expr_).value + 8) =
         *(undefined8 *)((long)&expr->value + 8);
    uVar2 = *(undefined4 *)&expr->field_0x4;
    uVar1 = (expr->value).i64;
    (this->data_init_expr_).type = expr->type;
    *(undefined4 *)&(this->data_init_expr_).field_0x4 = uVar2;
    (this->data_init_expr_).value.i64 = uVar1;
    RVar3 = InitExprToConstOffset(this,expr,&this->data_offset_);
    return (Result)RVar3.enum_;
  }
  if (this->in_elem_section_ == true) {
    *(undefined8 *)((long)&(this->elem_init_expr_).value + 8) =
         *(undefined8 *)((long)&expr->value + 8);
    uVar2 = *(undefined4 *)&expr->field_0x4;
    uVar1 = (expr->value).i64;
    (this->elem_init_expr_).type = expr->type;
    *(undefined4 *)&(this->elem_init_expr_).field_0x4 = uVar2;
    (this->elem_init_expr_).value.i64 = uVar1;
    RVar3 = InitExprToConstOffset(this,expr,&this->elem_offset_);
    return (Result)RVar3.enum_;
  }
  PrintInitExpr(this,expr);
  return (Result)extraout_EAX;
}

Assistant:

Result BinaryReaderObjdump::HandleInitExpr(const InitExpr& expr) {
  if (in_data_section_) {
    data_init_expr_ = expr;
    return InitExprToConstOffset(expr, &data_offset_);
  } else if (in_elem_section_) {
    elem_init_expr_ = expr;
    return InitExprToConstOffset(expr, &elem_offset_);
  } else {
    PrintInitExpr(expr);
  }
  return Result::Ok;
}